

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

void google::protobuf::compiler::php::GenerateAddFileToPool
               (FileDescriptor *file,bool is_descriptor,Printer *printer)

{
  iterator this;
  Printer *pPVar1;
  __type _Var2;
  bool bVar3;
  int iVar4;
  int iVar5;
  Descriptor *message;
  EnumDescriptor *en;
  FileDescriptor *this_00;
  FileDescriptorProto *proto;
  reference __lhs;
  pointer this_01;
  ulong uVar6;
  ulong uVar7;
  char *pcVar8;
  allocator local_1b1;
  string local_1b0;
  string local_190;
  string local_170;
  int local_14c;
  undefined1 local_148 [4];
  int i_3;
  string files_data;
  RepeatedPtrIterator<google::protobuf::DescriptorProto> local_120;
  iterator it_1;
  RepeatedPtrField<google::protobuf::DescriptorProto> *message_type;
  const_iterator local_108;
  iterator local_100;
  RepeatedPtrIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f8;
  iterator it;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *dependency;
  FileDescriptorProto *file_proto;
  FileDescriptorSet files;
  undefined1 local_90 [8];
  string dependency_filename;
  string *name;
  int local_60;
  int i_2;
  int i_1;
  allocator local_49;
  string local_48;
  int local_24;
  Printer *pPStack_20;
  int i;
  Printer *printer_local;
  FileDescriptor *pFStack_10;
  bool is_descriptor_local;
  FileDescriptor *file_local;
  
  pPStack_20 = printer;
  printer_local._7_1_ = is_descriptor;
  pFStack_10 = file;
  io::Printer::Print(printer,
                     "public static $is_initialized = false;\n\npublic static function initOnce() {\n"
                    );
  Indent(pPStack_20);
  io::Printer::Print(pPStack_20,
                     "$pool = \\Google\\Protobuf\\Internal\\DescriptorPool::getGeneratedPool();\n\nif (static::$is_initialized == true) {\n  return;\n}\n"
                    );
  if ((printer_local._7_1_ & 1) == 0) {
    for (name._4_4_ = 0; iVar5 = FileDescriptor::dependency_count(pFStack_10), name._4_4_ < iVar5;
        name._4_4_ = name._4_4_ + 1) {
      this_00 = FileDescriptor::dependency(pFStack_10,name._4_4_);
      dependency_filename.field_2._8_8_ = FileDescriptor::name_abi_cxx11_(this_00);
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              dependency_filename.field_2._8_8_,&kDescriptorFile_abi_cxx11_);
      if (!_Var2) {
        GeneratedMetadataFileName
                  ((string *)local_90,(string *)dependency_filename.field_2._8_8_,
                   (bool)(printer_local._7_1_ & 1));
        pPVar1 = pPStack_20;
        FilenameToClassname((string *)&files.file_.super_RepeatedPtrFieldBase.rep_,
                            (string *)local_90);
        io::Printer::Print(pPVar1,"\\^name^::initOnce();\n","name",
                           (string *)&files.file_.super_RepeatedPtrFieldBase.rep_);
        std::__cxx11::string::~string((string *)&files.file_.super_RepeatedPtrFieldBase.rep_);
        std::__cxx11::string::~string((string *)local_90);
      }
    }
    FileDescriptorSet::FileDescriptorSet((FileDescriptorSet *)&file_proto);
    proto = FileDescriptorSet::add_file((FileDescriptorSet *)&file_proto);
    FileDescriptor::CopyTo(pFStack_10,proto);
    it.it_ = (void **)FileDescriptorProto::mutable_dependency_abi_cxx11_(proto);
    local_f8.it_ = (void **)RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::begin((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)it.it_);
    while( true ) {
      local_100.it_ =
           (void **)RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::end(it.it_);
      bVar3 = internal::
              RepeatedPtrIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator!=(&local_f8,&local_100);
      if (!bVar3) break;
      __lhs = internal::
              RepeatedPtrIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator*(&local_f8);
      bVar3 = std::operator!=(__lhs,&kDescriptorFile_abi_cxx11_);
      this = it;
      if (bVar3) {
        internal::RepeatedPtrIterator<std::__cxx11::string_const>::
        RepeatedPtrIterator<std::__cxx11::string>
                  ((RepeatedPtrIterator<std::__cxx11::string_const> *)&local_108,&local_f8);
        RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::erase((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)this.it_,local_108);
        break;
      }
      internal::
      RepeatedPtrIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_f8);
    }
    FileDescriptorProto::clear_extension(proto);
    it_1.it_ = (void **)FileDescriptorProto::mutable_message_type(proto);
    local_120.it_ =
         (void **)RepeatedPtrField<google::protobuf::DescriptorProto>::begin
                            ((RepeatedPtrField<google::protobuf::DescriptorProto> *)it_1.it_);
    while( true ) {
      files_data.field_2._8_8_ =
           RepeatedPtrField<google::protobuf::DescriptorProto>::end
                     ((RepeatedPtrField<google::protobuf::DescriptorProto> *)it_1.it_);
      bVar3 = internal::RepeatedPtrIterator<google::protobuf::DescriptorProto>::operator!=
                        (&local_120,(iterator *)((long)&files_data.field_2 + 8));
      if (!bVar3) break;
      this_01 = internal::RepeatedPtrIterator<google::protobuf::DescriptorProto>::operator->
                          (&local_120);
      DescriptorProto::clear_extension(this_01);
      internal::RepeatedPtrIterator<google::protobuf::DescriptorProto>::operator++(&local_120);
    }
    std::__cxx11::string::string((string *)local_148);
    MessageLite::SerializeToString((MessageLite *)&file_proto,(string *)local_148);
    io::Printer::Print(pPStack_20,"$pool->internalAddGeneratedFile(hex2bin(\n");
    Indent(pPStack_20);
    for (local_14c = 0; uVar6 = (ulong)local_14c, uVar7 = std::__cxx11::string::size(),
        pPVar1 = pPStack_20, uVar6 < uVar7; local_14c = local_14c + 0x1e) {
      std::__cxx11::string::substr((ulong)&local_190,(ulong)local_148);
      BinaryToHex(&local_170,&local_190);
      iVar5 = local_14c + 0x1e;
      uVar6 = std::__cxx11::string::size();
      pcVar8 = "";
      if ((ulong)(long)iVar5 < uVar6) {
        pcVar8 = " .";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1b0,pcVar8,&local_1b1);
      io::Printer::Print(pPVar1,"\"^data^\"^dot^\n","data",&local_170,"dot",&local_1b0);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_190);
    }
    Outdent(pPStack_20);
    io::Printer::Print(pPStack_20,"));\n\n");
    std::__cxx11::string::~string((string *)local_148);
    FileDescriptorSet::~FileDescriptorSet((FileDescriptorSet *)&file_proto);
  }
  else {
    for (local_24 = 0; iVar5 = local_24, iVar4 = FileDescriptor::message_type_count(pFStack_10),
        iVar5 < iVar4; local_24 = local_24 + 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_48,"",&local_49);
      message = FileDescriptor::message_type(pFStack_10,local_24);
      GenerateMessageToPool(&local_48,message,pPStack_20);
      std::__cxx11::string::~string((string *)&local_48);
      std::allocator<char>::~allocator((allocator<char> *)&local_49);
    }
    for (local_60 = 0; iVar5 = FileDescriptor::enum_type_count(pFStack_10), local_60 < iVar5;
        local_60 = local_60 + 1) {
      en = FileDescriptor::enum_type(pFStack_10,local_60);
      GenerateEnumToPool(en,pPStack_20);
    }
    io::Printer::Print(pPStack_20,"$pool->finish();\n");
  }
  io::Printer::Print(pPStack_20,"static::$is_initialized = true;\n");
  Outdent(pPStack_20);
  io::Printer::Print(pPStack_20,"}\n");
  return;
}

Assistant:

void GenerateAddFileToPool(const FileDescriptor* file, bool is_descriptor,
                           io::Printer* printer) {
    printer->Print(
        "public static $is_initialized = false;\n\n"
        "public static function initOnce() {\n");
    Indent(printer);

    printer->Print(
        "$pool = \\Google\\Protobuf\\Internal\\"
        "DescriptorPool::getGeneratedPool();\n\n"
        "if (static::$is_initialized == true) {\n"
        "  return;\n"
        "}\n");

  if (is_descriptor) {
    for (int i = 0; i < file->message_type_count(); i++) {
      GenerateMessageToPool("", file->message_type(i), printer);
    }
    for (int i = 0; i < file->enum_type_count(); i++) {
      GenerateEnumToPool(file->enum_type(i), printer);
    }

    printer->Print(
        "$pool->finish();\n");
  } else {
    for (int i = 0; i < file->dependency_count(); i++) {
      const std::string& name = file->dependency(i)->name();
      // Currently, descriptor.proto is not ready for external usage. Skip to
      // import it for now, so that its dependencies can still work as long as
      // they don't use protos defined in descriptor.proto.
      if (name == kDescriptorFile) {
        continue;
      }
      std::string dependency_filename =
          GeneratedMetadataFileName(name, is_descriptor);
      printer->Print(
          "\\^name^::initOnce();\n",
          "name", FilenameToClassname(dependency_filename));
    }

    // Add messages and enums to descriptor pool.
    FileDescriptorSet files;
    FileDescriptorProto* file_proto = files.add_file();
    file->CopyTo(file_proto);

    // Filter out descriptor.proto as it cannot be depended on for now.
    RepeatedPtrField<string>* dependency = file_proto->mutable_dependency();
    for (RepeatedPtrField<string>::iterator it = dependency->begin();
         it != dependency->end(); ++it) {
      if (*it != kDescriptorFile) {
        dependency->erase(it);
        break;
      }
    }

    // Filter out all extensions, since we do not support extension yet.
    file_proto->clear_extension();
    RepeatedPtrField<DescriptorProto>* message_type =
        file_proto->mutable_message_type();
    for (RepeatedPtrField<DescriptorProto>::iterator it = message_type->begin();
         it != message_type->end(); ++it) {
      it->clear_extension();
    }

    string files_data;
    files.SerializeToString(&files_data);

    printer->Print("$pool->internalAddGeneratedFile(hex2bin(\n");
    Indent(printer);

    // Only write 30 bytes per line.
    static const int kBytesPerLine = 30;
    for (int i = 0; i < files_data.size(); i += kBytesPerLine) {
      printer->Print(
          "\"^data^\"^dot^\n",
          "data", BinaryToHex(files_data.substr(i, kBytesPerLine)),
          "dot", i + kBytesPerLine < files_data.size() ? " ." : "");
    }

    Outdent(printer);
    printer->Print(
        "));\n\n");
  }
  printer->Print(
      "static::$is_initialized = true;\n");
  Outdent(printer);
  printer->Print("}\n");
}